

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_avx2_256_64.c
# Opt level: O0

parasail_result_t *
parasail_nw_rowcol_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined8 uVar1;
  __m256i vH_00;
  undefined1 auVar2 [32];
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i alVar3;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [24];
  undefined1 auVar19 [24];
  long lVar20;
  __m256i *palVar21;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  longlong lVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  __m256i vH_2;
  __m256i vH_1;
  __m256i vFt;
  __m256i vW;
  __m256i *pvW;
  __m256i vHp;
  __m256i vH;
  __m256i vF;
  __m256i vHt;
  __m256i vE;
  __m256i vGapper;
  int64_t tmp_1;
  int64_t tmp;
  __m256i_64_t e;
  __m256i_64_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m256i vSegLenXgap;
  __m256i vNegInfFront;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int64_t score;
  __m256i vZero;
  int64_t POS_LIMIT;
  int64_t NEG_LIMIT;
  __m256i vGapE;
  __m256i vGapO;
  __m256i *pvGapper;
  __m256i *pvH;
  __m256i *pvHt;
  int64_t *boundary;
  __m256i *pvE;
  __m256i *pvP;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int64_t local_c20;
  long local_c18;
  long in_stack_fffffffffffff3f0;
  long lVar52;
  undefined8 in_stack_fffffffffffff400;
  undefined8 in_stack_fffffffffffff408;
  longlong lVar53;
  longlong in_stack_fffffffffffff410;
  longlong lVar54;
  longlong lStack_be8;
  undefined8 in_stack_fffffffffffff438;
  undefined8 in_stack_fffffffffffff440;
  undefined8 in_stack_fffffffffffff448;
  longlong in_stack_fffffffffffff450;
  undefined8 in_stack_fffffffffffff458;
  undefined8 in_stack_fffffffffffff460;
  undefined8 in_stack_fffffffffffff468;
  longlong in_stack_fffffffffffff470;
  __m256i local_b60;
  __m256i local_b40;
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  longlong local_ae0;
  longlong lStack_ad8;
  longlong lStack_ad0;
  longlong lStack_ac8;
  undefined1 local_ac0 [32];
  longlong local_a80 [4];
  longlong local_a60 [6];
  int local_a30;
  int local_a2c;
  parasail_result_t *local_a28;
  undefined1 local_a20 [32];
  ulong local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  ulong local_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  ulong local_910;
  ulong local_908;
  undefined1 local_900 [16];
  undefined1 auStack_8f0 [16];
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  __m256i *local_8c0;
  __m256i *local_8b8;
  __m256i *local_8b0;
  int64_t *local_8a8;
  __m256i *local_8a0;
  long local_898;
  int local_890;
  int local_88c;
  int local_888;
  int local_884;
  long local_880;
  int local_874;
  int local_870;
  int local_86c;
  int local_868;
  int local_864;
  int local_860;
  int local_85c;
  int local_858;
  int local_854;
  long local_850;
  parasail_result_t *local_840;
  ulong local_838;
  ulong local_830;
  ulong local_828;
  ulong local_820;
  ulong local_818;
  ulong local_810;
  ulong local_808;
  undefined1 local_800 [32];
  ulong local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  longlong local_760;
  longlong lStack_758;
  longlong lStack_750;
  longlong lStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  longlong local_720;
  longlong lStack_718;
  longlong lStack_710;
  longlong lStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  longlong lStack_6d0;
  undefined8 uStack_6c8;
  longlong local_6c0;
  longlong lStack_6b8;
  longlong lStack_6b0;
  longlong lStack_6a8;
  undefined1 local_6a0 [32];
  ulong local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  longlong local_660;
  longlong lStack_658;
  longlong lStack_650;
  longlong lStack_648;
  __m256i *local_628;
  longlong local_620;
  longlong lStack_618;
  longlong lStack_610;
  longlong lStack_608;
  __m256i *local_5e8;
  longlong local_5e0;
  longlong lStack_5d8;
  longlong lStack_5d0;
  longlong lStack_5c8;
  __m256i *local_5a8;
  longlong local_5a0;
  longlong lStack_598;
  longlong lStack_590;
  longlong lStack_588;
  __m256i *local_568;
  __m256i *local_528;
  __m256i *local_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [16];
  undefined1 auStack_490 [16];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  longlong lStack_428;
  undefined1 local_420 [16];
  undefined1 auStack_410 [16];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  longlong lStack_3e8;
  longlong local_3e0;
  longlong lStack_3d8;
  longlong lStack_3d0;
  longlong lStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [16];
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [32];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [32];
  __m256i *local_320;
  __m256i *local_318;
  __m256i *local_310;
  __m256i *local_308;
  undefined8 *local_300;
  __m256i *local_2f8;
  __m256i *local_2f0;
  __m256i *local_2e8;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [16];
  undefined1 auStack_1f0 [16];
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  undefined1 local_1c0 [32];
  ulong local_1a0;
  ulong local_198;
  ulong local_190;
  ulong local_188;
  undefined1 local_180 [16];
  undefined1 auStack_170 [16];
  ulong local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  undefined1 local_140 [16];
  undefined1 auStack_130 [16];
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_860 = 0;
  local_864 = 0;
  local_868 = 0;
  local_86c = 0;
  local_870 = 0;
  local_874 = 0;
  local_880 = 0;
  local_884 = 0;
  local_888 = 0;
  local_88c = 0;
  local_890 = 0;
  local_898 = 0;
  local_8a0 = (__m256i *)0x0;
  local_8a8 = (int64_t *)0x0;
  local_8b0 = (__m256i *)0x0;
  local_8b8 = (__m256i *)0x0;
  local_8c0 = (__m256i *)0x0;
  local_908 = 0;
  local_910 = 0;
  local_948 = 0;
  local_a28 = (parasail_result_t *)0x0;
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_rowcol_scan_profile_avx2_256_64","profile");
    local_840 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x60) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_rowcol_scan_profile_avx2_256_64",
            "profile->profile64.score");
    local_840 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_rowcol_scan_profile_avx2_256_64",
            "profile->matrix");
    local_840 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_rowcol_scan_profile_avx2_256_64",
            "profile->s1Len");
    local_840 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_rowcol_scan_profile_avx2_256_64","s2");
    local_840 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_rowcol_scan_profile_avx2_256_64","s2Len");
    local_840 = (parasail_result_t *)0x0;
  }
  else if (in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_rowcol_scan_profile_avx2_256_64","open");
    local_840 = (parasail_result_t *)0x0;
  }
  else if (in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_rowcol_scan_profile_avx2_256_64","gap");
    local_840 = (parasail_result_t *)0x0;
  }
  else {
    local_860 = 0;
    local_864 = 0;
    local_868 = 0;
    local_86c = *(int *)(in_RDI + 8);
    local_870 = local_86c + -1;
    local_874 = in_EDX + -1;
    local_880 = *(long *)(in_RDI + 0x10);
    local_884 = 4;
    local_888 = (local_86c + 3) / 4;
    local_88c = (local_86c + -1) % local_888;
    local_890 = ~((local_86c + -1) / local_888) + 4;
    local_898 = *(long *)(in_RDI + 0x60);
    local_808 = (ulong)in_ECX;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_808;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_808;
    local_200 = vpunpcklqdq_avx(auVar22,auVar30);
    auVar31._8_8_ = 0;
    auVar31._0_8_ = local_808;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = local_808;
    auStack_1f0 = vpunpcklqdq_avx(auVar31,auVar37);
    local_8e0 = local_200._0_8_;
    uStack_8d8 = local_200._8_8_;
    uStack_8d0 = auStack_1f0._0_8_;
    uStack_8c8 = auStack_1f0._8_8_;
    local_810 = (ulong)in_R8D;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_810;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = local_810;
    auVar22 = vpunpcklqdq_avx(auVar23,auVar32);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = local_810;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = local_810;
    auVar23 = vpunpcklqdq_avx(auVar24,auVar38);
    local_1c0._0_16_ = ZEXT116(0) * auVar22 + ZEXT116(1) * auVar23;
    local_1c0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar22;
    if (-in_ECX < *(int *)(local_880 + 0x20)) {
      lVar20 = (long)in_ECX;
    }
    else {
      lVar20 = -(long)*(int *)(local_880 + 0x20);
    }
    lVar52 = lVar20 + -0x8000000000000000;
    local_a00 = lVar20 + 0x8000000000000001;
    local_910 = 0x7ffffffffffffffe - (long)*(int *)(local_880 + 0x1c);
    local_800._8_8_ = SUB328(ZEXT832(0),4);
    local_940 = 0;
    uStack_938 = local_800._8_8_;
    uStack_930 = 0;
    uStack_928 = 0;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_a00;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = local_a00;
    local_180 = vpunpcklqdq_avx(auVar25,auVar33);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = local_a00;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = local_a00;
    auStack_170 = vpunpcklqdq_avx(auVar34,auVar39);
    local_980 = local_180._0_8_;
    uStack_978 = local_180._8_8_;
    uStack_970 = auStack_170._0_8_;
    uStack_968 = auStack_170._8_8_;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = local_910;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = local_910;
    local_140 = vpunpcklqdq_avx(auVar26,auVar35);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = local_910;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = local_910;
    auStack_130 = vpunpcklqdq_avx(auVar36,auVar40);
    local_9a0 = local_140._0_8_;
    uStack_998 = local_140._8_8_;
    uStack_990 = auStack_130._0_8_;
    uStack_988 = auStack_130._8_8_;
    local_9c0 = local_140._0_8_;
    uStack_9b8 = local_140._8_8_;
    uStack_9b0 = auStack_130._0_8_;
    uStack_9a8 = auStack_130._8_8_;
    local_9e0 = local_180._0_8_;
    uStack_9d8 = local_180._8_8_;
    uStack_9d0 = auStack_170._0_8_;
    uStack_9c8 = auStack_170._8_8_;
    uStack_9f8 = local_800._8_8_;
    uStack_9f0 = 0;
    uStack_9e8 = 0;
    local_828 = (ulong)(-local_888 * in_R8D);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_828;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = local_828;
    local_100 = vpunpcklqdq_avx(auVar27,auVar41);
    auVar42._8_8_ = 0;
    auVar42._0_8_ = local_828;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = local_828;
    auStack_f0 = vpunpcklqdq_avx(auVar42,auVar45);
    auVar17._16_16_ = auStack_f0;
    auVar17._0_16_ = local_100;
    local_830 = (ulong)(-local_888 * in_R8D);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = local_830;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = local_830;
    local_c0 = vpunpcklqdq_avx(auVar43,auVar46);
    auVar47._8_8_ = 0;
    auVar47._0_8_ = local_830;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = local_830;
    auStack_b0 = vpunpcklqdq_avx(auVar47,auVar48);
    auVar28._16_16_ = auStack_b0;
    auVar28._0_16_ = local_c0;
    local_838 = (ulong)(-local_888 * in_R8D);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = local_838;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = local_838;
    local_80 = vpunpcklqdq_avx(auVar44,auVar49);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = local_838;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = local_838;
    local_70 = vpunpcklqdq_avx(auVar50,auVar51);
    auVar28 = vperm2i128_avx2(ZEXT1632(local_80),auVar28,0x28);
    local_6a0 = vpalignr_avx2(auVar17,auVar28,8);
    uStack_678 = local_800._8_8_;
    uStack_670 = 0;
    uStack_668 = 0;
    local_a20 = vpaddq_avx2(ZEXT1632(CONCAT88(local_800._8_8_,local_a00)),local_6a0);
    local_948 = local_a00;
    local_908 = local_a00;
    local_85c = in_R8D;
    local_858 = in_ECX;
    local_854 = in_EDX;
    local_850 = in_RSI;
    local_820 = local_910;
    local_818 = local_a00;
    local_800 = ZEXT832(0) << 0x20;
    local_680 = local_a00;
    local_1e0 = local_808;
    local_1d8 = local_808;
    local_1d0 = local_808;
    local_1c8 = local_808;
    local_1a0 = local_810;
    local_198 = local_810;
    local_190 = local_810;
    local_188 = local_810;
    local_160 = local_a00;
    local_158 = local_a00;
    local_150 = local_a00;
    local_148 = local_a00;
    local_120 = local_910;
    local_118 = local_910;
    local_110 = local_910;
    local_108 = local_910;
    local_e0 = local_828;
    local_d8 = local_828;
    local_d0 = local_828;
    local_c8 = local_828;
    local_a0 = local_830;
    local_98 = local_830;
    local_90 = local_830;
    local_88 = local_830;
    local_50 = local_838;
    local_48 = local_838;
    local_40 = local_838;
    local_38 = local_838;
    local_900 = local_1c0._0_16_;
    auStack_8f0 = local_1c0._16_16_;
    local_a28 = parasail_result_new_rowcol1(local_888 * 4,in_EDX);
    if (local_a28 == (parasail_result_t *)0x0) {
      local_840 = (parasail_result_t *)0x0;
    }
    else {
      local_a28->flag = local_a28->flag | 0x4800401;
      local_a28->flag = local_a28->flag | 0x40000;
      local_8a0 = parasail_memalign___m256i(0x20,(long)local_888);
      local_8a8 = parasail_memalign_int64_t(0x20,(long)(local_854 + 1));
      local_8b0 = parasail_memalign___m256i(0x20,(long)local_888);
      local_8b8 = parasail_memalign___m256i(0x20,(long)local_888);
      local_8c0 = parasail_memalign___m256i(0x20,(long)local_888);
      if (local_8a0 == (__m256i *)0x0) {
        local_840 = (parasail_result_t *)0x0;
      }
      else if (local_8a8 == (int64_t *)0x0) {
        local_840 = (parasail_result_t *)0x0;
      }
      else if (local_8b0 == (__m256i *)0x0) {
        local_840 = (parasail_result_t *)0x0;
      }
      else if (local_8b8 == (__m256i *)0x0) {
        local_840 = (parasail_result_t *)0x0;
      }
      else if (local_8c0 == (__m256i *)0x0) {
        local_840 = (parasail_result_t *)0x0;
      }
      else {
        local_a2c = 0;
        local_860 = 0;
        while( true ) {
          if (local_888 <= local_860) break;
          for (local_a30 = 0; local_a30 < local_884; local_a30 = local_a30 + 1) {
            local_c18 = (long)(-(local_85c * (local_a30 * local_888 + local_860)) - local_858);
            in_stack_fffffffffffff3f0 = local_c18;
            if (local_c18 < -0x8000000000000000) {
              in_stack_fffffffffffff3f0 = -0x8000000000000000;
            }
            local_a60[local_a30] = in_stack_fffffffffffff3f0;
            local_c18 = local_c18 - local_858;
            if (local_c18 < -0x8000000000000000) {
              local_c18 = -0x8000000000000000;
            }
            local_a80[local_a30] = local_c18;
          }
          local_4e8 = local_8b8 + local_a2c;
          (*local_4e8)[0] = local_a60[0];
          (*local_4e8)[1] = local_a60[1];
          (*local_4e8)[2] = local_a60[2];
          (*local_4e8)[3] = local_a60[3];
          local_528 = local_8a0 + local_a2c;
          (*local_528)[0] = local_a80[0];
          (*local_528)[1] = local_a80[1];
          (*local_528)[2] = local_a80[2];
          (*local_528)[3] = local_a80[3];
          local_a2c = local_a2c + 1;
          local_860 = local_860 + 1;
        }
        *local_8a8 = 0;
        for (local_860 = 1; local_860 <= local_854; local_860 = local_860 + 1) {
          local_c20 = (int64_t)(-(local_85c * (local_860 + -1)) - local_858);
          if (local_c20 < -0x8000000000000000) {
            local_c20 = -0x8000000000000000;
          }
          local_8a8[local_860] = local_c20;
        }
        local_340._8_8_ = uStack_938;
        local_340._0_8_ = local_940;
        local_340._16_8_ = uStack_930;
        local_340._24_8_ = uStack_928;
        local_360 = local_8e0;
        uStack_358 = uStack_8d8;
        uStack_350 = uStack_8d0;
        uStack_348 = uStack_8c8;
        auVar12._8_8_ = uStack_8d8;
        auVar12._0_8_ = local_8e0;
        auVar12._16_8_ = uStack_8d0;
        auVar12._24_8_ = uStack_8c8;
        local_ac0 = vpsubq_avx2(local_340,auVar12);
        local_860 = local_888;
        while (local_860 = local_860 + -1, -1 < local_860) {
          local_568 = local_8c0 + local_860;
          local_5a0 = local_ac0._0_8_;
          lStack_598 = local_ac0._8_8_;
          lStack_590 = local_ac0._16_8_;
          lStack_588 = local_ac0._24_8_;
          (*local_568)[0] = local_ac0._0_8_;
          (*local_568)[1] = local_ac0._8_8_;
          (*local_568)[2] = local_ac0._16_8_;
          (*local_568)[3] = local_ac0._24_8_;
          local_380 = local_ac0;
          uStack_390 = auStack_8f0._0_8_;
          uStack_388 = auStack_8f0._8_8_;
          auVar11._16_8_ = auStack_8f0._0_8_;
          auVar11._0_16_ = local_900;
          auVar11._24_8_ = auStack_8f0._8_8_;
          local_ac0 = vpsubq_avx2(local_ac0,auVar11);
          local_3a0 = local_900;
        }
        for (local_864 = 0; local_864 < local_854; local_864 = local_864 + 1) {
          local_2e8 = local_8b8 + (local_888 + -1);
          auVar28 = vpermq_avx2((undefined1  [32])*local_2e8,0x90);
          auVar28 = vpblendd_avx2(auVar28,ZEXT1632(ZEXT816(0) << 0x40),3);
          local_b60 = (__m256i)vpblendd_avx2(auVar28,ZEXT832((ulong)local_8a8[local_864]),3);
          lVar20 = local_898 +
                   (long)(*(int *)(*(long *)(local_880 + 0x10) +
                                  (ulong)*(byte *)(local_850 + local_864) * 4) * local_888) * 0x20;
          local_3e0 = (*local_8c0)[0];
          lStack_3d8 = (*local_8c0)[1];
          lStack_3d0 = (*local_8c0)[2];
          lStack_3c8 = (*local_8c0)[3];
          local_3c0 = local_980;
          uStack_3b8 = uStack_978;
          uStack_3b0 = uStack_970;
          uStack_3a8 = uStack_968;
          auVar10._8_8_ = uStack_978;
          auVar10._0_8_ = local_980;
          auVar10._16_8_ = uStack_970;
          auVar10._24_8_ = uStack_968;
          local_b00 = vpsubq_avx2(auVar10,(undefined1  [32])*local_8c0);
          local_b20._8_8_ = uStack_978;
          local_b20._0_8_ = local_980;
          local_b20._16_8_ = uStack_970;
          local_b20._24_8_ = uStack_968;
          local_860 = 0;
          while( true ) {
            if (local_888 <= local_860) break;
            local_2f0 = local_8b8 + local_860;
            auVar18 = *(undefined1 (*) [24])*local_2f0;
            lStack_428 = (*local_2f0)[3];
            alVar3 = *local_2f0;
            local_2f8 = local_8a0 + local_860;
            auVar19 = *(undefined1 (*) [24])*local_2f8;
            lStack_3e8 = (*local_2f8)[3];
            local_300 = (undefined8 *)(lVar20 + (long)local_860 * 0x20);
            in_stack_fffffffffffff460 = *local_300;
            in_stack_fffffffffffff468 = local_300[1];
            in_stack_fffffffffffff470 = local_300[2];
            uVar1 = local_300[3];
            local_ae0 = auVar19._0_8_;
            lStack_ad8 = auVar19._8_8_;
            lStack_ad0 = auVar19._16_8_;
            local_400 = local_ae0;
            uStack_3f8 = lStack_ad8;
            uStack_3f0 = lStack_ad0;
            auVar9._16_8_ = auStack_8f0._0_8_;
            auVar9._0_16_ = local_900;
            auVar9._24_8_ = auStack_8f0._8_8_;
            auVar28 = vpsubq_avx2((undefined1  [32])*local_2f8,auVar9);
            local_b40[0] = auVar18._0_8_;
            local_b40[1] = auVar18._8_8_;
            local_b40[2] = auVar18._16_8_;
            local_440 = local_b40[0];
            uStack_438 = local_b40[1];
            uStack_430 = local_b40[2];
            local_460 = local_8e0;
            uStack_458 = uStack_8d8;
            uStack_450 = uStack_8d0;
            uStack_448 = uStack_8c8;
            auVar8._8_8_ = uStack_8d8;
            auVar8._0_8_ = local_8e0;
            auVar8._16_8_ = uStack_8d0;
            auVar8._24_8_ = uStack_8c8;
            vpsubq_avx2((undefined1  [32])*local_2f0,auVar8);
            a[1] = in_stack_fffffffffffff460;
            a[0] = in_stack_fffffffffffff458;
            a[2] = in_stack_fffffffffffff468;
            a[3] = in_stack_fffffffffffff470;
            b[1] = in_stack_fffffffffffff440;
            b[0] = in_stack_fffffffffffff438;
            b[2] = in_stack_fffffffffffff448;
            b[3] = in_stack_fffffffffffff450;
            local_420 = local_900;
            auStack_410 = auStack_8f0;
            _mm256_max_epi64_rpl(a,b);
            local_6c0 = local_b60[0];
            lStack_6b8 = local_b60[1];
            lStack_6b0 = local_b60[2];
            lStack_6a8 = local_b60[3];
            auVar5._8_8_ = in_stack_fffffffffffff468;
            auVar5._0_8_ = in_stack_fffffffffffff460;
            auVar5._16_8_ = in_stack_fffffffffffff470;
            auVar5._24_8_ = uVar1;
            vpaddq_avx2((undefined1  [32])local_b60,auVar5);
            palVar21 = local_8c0 + local_860;
            local_720 = (*palVar21)[0];
            lStack_718 = (*palVar21)[1];
            lStack_710 = (*palVar21)[2];
            lStack_708 = (*palVar21)[3];
            local_700 = local_b00._0_8_;
            uStack_6f8 = local_b00._8_8_;
            uStack_6f0 = local_b00._16_8_;
            uStack_6e8 = local_b00._24_8_;
            vpaddq_avx2(local_b00,(undefined1  [32])*palVar21);
            a_00[1] = in_stack_fffffffffffff460;
            a_00[0] = in_stack_fffffffffffff458;
            a_00[2] = in_stack_fffffffffffff468;
            a_00[3] = in_stack_fffffffffffff470;
            b_00[1] = in_stack_fffffffffffff440;
            b_00[0] = in_stack_fffffffffffff438;
            b_00[2] = in_stack_fffffffffffff448;
            b_00[3] = in_stack_fffffffffffff450;
            local_6e0 = in_stack_fffffffffffff460;
            uStack_6d8 = in_stack_fffffffffffff468;
            lStack_6d0 = in_stack_fffffffffffff470;
            uStack_6c8 = uVar1;
            _mm256_max_epi64_rpl(a_00,b_00);
            local_ae0 = auVar28._0_8_;
            lStack_ad8 = auVar28._8_8_;
            lStack_ad0 = auVar28._16_8_;
            lStack_ac8 = auVar28._24_8_;
            a_01[1] = in_stack_fffffffffffff460;
            a_01[0] = in_stack_fffffffffffff458;
            a_01[2] = in_stack_fffffffffffff468;
            a_01[3] = in_stack_fffffffffffff470;
            b_01[1] = in_stack_fffffffffffff440;
            b_01[0] = in_stack_fffffffffffff438;
            b_01[2] = in_stack_fffffffffffff448;
            b_01[3] = in_stack_fffffffffffff450;
            local_b00._0_8_ = local_ae0;
            local_b00._8_8_ = lStack_ad8;
            local_b00._16_8_ = lStack_ad0;
            local_b00._24_8_ = lStack_ac8;
            _mm256_max_epi64_rpl(a_01,b_01);
            local_5a8 = local_8a0 + local_860;
            local_5e0 = local_ae0;
            lStack_5d8 = lStack_ad8;
            lStack_5d0 = lStack_ad0;
            lStack_5c8 = lStack_ac8;
            (*local_5a8)[0] = local_ae0;
            (*local_5a8)[1] = lStack_ad8;
            (*local_5a8)[2] = lStack_ad0;
            (*local_5a8)[3] = lStack_ac8;
            local_5e8 = local_8b0 + local_860;
            (*local_5e8)[0] = local_b00._0_8_;
            (*local_5e8)[1] = local_b00._8_8_;
            (*local_5e8)[2] = local_b00._16_8_;
            (*local_5e8)[3] = local_b00._24_8_;
            local_860 = local_860 + 1;
            local_b60 = alVar3;
            local_620 = local_b00._0_8_;
            lStack_618 = local_b00._8_8_;
            lStack_610 = local_b00._16_8_;
            lStack_608 = local_b00._24_8_;
          }
          auVar28 = vpermq_avx2(local_b00,0x90);
          auVar28 = vpblendd_avx2(auVar28,ZEXT1632(ZEXT816(0) << 0x40),3);
          auVar28 = vpblendd_avx2(auVar28,ZEXT832((ulong)local_8a8[(long)local_864 + 1]),3);
          local_b00._0_8_ = auVar28._0_8_;
          local_b00._8_8_ = auVar28._8_8_;
          local_b00._16_8_ = auVar28._16_8_;
          local_b00._24_8_ = auVar28._24_8_;
          local_760 = (*local_8c0)[0];
          lStack_758 = (*local_8c0)[1];
          lStack_750 = (*local_8c0)[2];
          lStack_748 = (*local_8c0)[3];
          local_740 = local_b00._0_8_;
          uStack_738 = local_b00._8_8_;
          uStack_730 = local_b00._16_8_;
          uStack_728 = local_b00._24_8_;
          vpaddq_avx2(auVar28,(undefined1  [32])*local_8c0);
          a_02[1] = in_stack_fffffffffffff460;
          a_02[0] = in_stack_fffffffffffff458;
          a_02[2] = in_stack_fffffffffffff468;
          a_02[3] = in_stack_fffffffffffff470;
          alVar3[1] = in_stack_fffffffffffff440;
          alVar3[0] = in_stack_fffffffffffff438;
          alVar3[2] = in_stack_fffffffffffff448;
          alVar3[3] = in_stack_fffffffffffff450;
          _mm256_max_epi64_rpl(a_02,alVar3);
          for (local_860 = 0; local_860 < local_884 + -2; local_860 = local_860 + 1) {
            auVar28 = vpermq_avx2(local_b20,0x90);
            auVar28 = vpblendd_avx2(auVar28,ZEXT832(0),3);
            local_780 = auVar28._0_8_;
            uStack_778 = auVar28._8_8_;
            uStack_770 = auVar28._16_8_;
            uStack_768 = auVar28._24_8_;
            local_7a0 = local_a20._0_8_;
            uStack_798 = local_a20._8_8_;
            uStack_790 = local_a20._16_8_;
            uStack_788 = local_a20._24_8_;
            auVar28 = vpaddq_avx2(auVar28,local_a20);
            in_stack_fffffffffffff440 = auVar28._0_8_;
            in_stack_fffffffffffff448 = auVar28._8_8_;
            in_stack_fffffffffffff450 = auVar28._16_8_;
            in_stack_fffffffffffff458 = auVar28._24_8_;
            a_03[1] = in_stack_fffffffffffff460;
            a_03[0] = in_stack_fffffffffffff458;
            a_03[2] = in_stack_fffffffffffff468;
            a_03[3] = in_stack_fffffffffffff470;
            b_02[1] = in_stack_fffffffffffff440;
            b_02[0] = in_stack_fffffffffffff438;
            b_02[2] = in_stack_fffffffffffff448;
            b_02[3] = in_stack_fffffffffffff450;
            _mm256_max_epi64_rpl(a_03,b_02);
          }
          auVar28 = vpermq_avx2(local_b20,0x90);
          auVar28 = vpblendd_avx2(auVar28,ZEXT832(0),3);
          local_b20._0_8_ = auVar28._0_8_;
          local_b20._8_8_ = auVar28._8_8_;
          local_b20._16_8_ = auVar28._16_8_;
          local_b20._24_8_ = auVar28._24_8_;
          local_7c0 = local_b20._0_8_;
          uStack_7b8 = local_b20._8_8_;
          uStack_7b0 = local_b20._16_8_;
          uStack_7a8 = local_b20._24_8_;
          local_7e0 = local_a00;
          uStack_7d8 = uStack_9f8;
          uStack_7d0 = uStack_9f0;
          uStack_7c8 = uStack_9e8;
          auVar4._8_8_ = uStack_9f8;
          auVar4._0_8_ = local_a00;
          auVar4._16_8_ = uStack_9f0;
          auVar4._24_8_ = uStack_9e8;
          local_b20 = vpaddq_avx2(auVar28,auVar4);
          a_04[1] = in_stack_fffffffffffff460;
          a_04[0] = in_stack_fffffffffffff458;
          a_04[2] = in_stack_fffffffffffff468;
          a_04[3] = in_stack_fffffffffffff470;
          b_03[1] = in_stack_fffffffffffff440;
          b_03[0] = in_stack_fffffffffffff438;
          b_03[2] = in_stack_fffffffffffff448;
          b_03[3] = in_stack_fffffffffffff450;
          _mm256_max_epi64_rpl(a_04,b_03);
          local_b40[1] = local_b00._8_8_;
          local_b40[0] = local_b00._0_8_;
          local_b40[2] = local_b00._16_8_;
          local_b40[3] = local_b00._24_8_;
          local_860 = 0;
          while( true ) {
            if (local_888 <= local_860) break;
            local_308 = local_8b0 + local_860;
            auVar18 = *(undefined1 (*) [24])*local_308;
            lVar29 = (*local_308)[3];
            local_480 = local_b20._0_8_;
            uStack_478 = local_b20._8_8_;
            uStack_470 = local_b20._16_8_;
            uStack_468 = local_b20._24_8_;
            auVar7._16_8_ = auStack_8f0._0_8_;
            auVar7._0_16_ = local_900;
            auVar7._24_8_ = auStack_8f0._8_8_;
            local_b20 = vpsubq_avx2(local_b20,auVar7);
            local_4c0 = local_b40[0];
            uStack_4b8 = local_b40[1];
            uStack_4b0 = local_b40[2];
            uStack_4a8 = local_b40[3];
            local_4e0 = local_8e0;
            uStack_4d8 = uStack_8d8;
            uStack_4d0 = uStack_8d0;
            uStack_4c8 = uStack_8c8;
            auVar6._8_8_ = uStack_8d8;
            auVar6._0_8_ = local_8e0;
            auVar6._16_8_ = uStack_8d0;
            auVar6._24_8_ = uStack_8c8;
            vpsubq_avx2((undefined1  [32])local_b40,auVar6);
            a_05[1] = in_stack_fffffffffffff460;
            a_05[0] = in_stack_fffffffffffff458;
            a_05[2] = in_stack_fffffffffffff468;
            a_05[3] = in_stack_fffffffffffff470;
            b_04[1] = in_stack_fffffffffffff440;
            b_04[0] = in_stack_fffffffffffff438;
            b_04[2] = in_stack_fffffffffffff448;
            b_04[3] = in_stack_fffffffffffff450;
            local_4a0 = local_900;
            auStack_490 = auStack_8f0;
            _mm256_max_epi64_rpl(a_05,b_04);
            local_b00._0_8_ = auVar18._0_8_;
            local_b00._8_8_ = auVar18._8_8_;
            local_b00._16_8_ = auVar18._16_8_;
            a_06[1] = in_stack_fffffffffffff460;
            a_06[0] = in_stack_fffffffffffff458;
            a_06[2] = in_stack_fffffffffffff468;
            a_06[3] = in_stack_fffffffffffff470;
            b_05[1] = in_stack_fffffffffffff440;
            b_05[0] = in_stack_fffffffffffff438;
            b_05[2] = in_stack_fffffffffffff448;
            b_05[3] = in_stack_fffffffffffff450;
            _mm256_max_epi64_rpl(a_06,b_05);
            local_b40[1] = local_b00._8_8_;
            local_b40[0] = local_b00._0_8_;
            local_b40[2] = local_b00._16_8_;
            local_b40[3] = lVar29;
            local_628 = local_8b8 + local_860;
            (*local_628)[0] = local_b00._0_8_;
            (*local_628)[1] = local_b00._8_8_;
            (*local_628)[2] = local_b00._16_8_;
            (*local_628)[3] = lVar29;
            a_07[1] = in_stack_fffffffffffff460;
            a_07[0] = in_stack_fffffffffffff458;
            a_07[2] = in_stack_fffffffffffff468;
            a_07[3] = in_stack_fffffffffffff470;
            b_06[1] = in_stack_fffffffffffff440;
            b_06[0] = in_stack_fffffffffffff438;
            b_06[2] = in_stack_fffffffffffff448;
            b_06[3] = in_stack_fffffffffffff450;
            local_660 = local_b00._0_8_;
            lStack_658 = local_b00._8_8_;
            lStack_650 = local_b00._16_8_;
            lStack_648 = lVar29;
            _mm256_min_epi64_rpl(a_07,b_06);
            a_08[1] = in_stack_fffffffffffff460;
            a_08[0] = in_stack_fffffffffffff458;
            a_08[2] = in_stack_fffffffffffff468;
            a_08[3] = in_stack_fffffffffffff470;
            b_07[1] = in_stack_fffffffffffff440;
            b_07[0] = in_stack_fffffffffffff438;
            b_07[2] = in_stack_fffffffffffff448;
            b_07[3] = in_stack_fffffffffffff450;
            _mm256_max_epi64_rpl(a_08,b_07);
            local_860 = local_860 + 1;
          }
          local_310 = local_8b8 + local_88c;
          local_b40 = *local_310;
          for (local_868 = 0; local_868 < local_890; local_868 = local_868 + 1) {
            auVar28 = vpermq_avx2((undefined1  [32])local_b40,0x90);
            local_b40 = (__m256i)vpblendd_avx2(auVar28,ZEXT1632(ZEXT816(0) << 0x40),3);
          }
          ((local_a28->field_4).rowcols)->score_row[local_864] = (int)local_b40[3];
        }
        for (local_860 = 0; local_860 < local_888; local_860 = local_860 + 1) {
          local_318 = local_8b8 + local_860;
          vH_00[1] = in_stack_fffffffffffff400;
          vH_00[0] = lVar52;
          vH_00[2] = in_stack_fffffffffffff408;
          vH_00[3] = in_stack_fffffffffffff410;
          arr_store_col((int *)(*local_318)[0],vH_00,
                        (int32_t)((ulong)in_stack_fffffffffffff3f0 >> 0x20),
                        (int32_t)in_stack_fffffffffffff3f0);
        }
        local_320 = local_8b8 + local_88c;
        lVar29 = (*local_320)[0];
        lVar53 = (*local_320)[1];
        lVar54 = (*local_320)[2];
        lStack_be8 = (*local_320)[3];
        for (local_868 = 0; local_868 < local_890; local_868 = local_868 + 1) {
          auVar2._8_8_ = lVar53;
          auVar2._0_8_ = lVar29;
          auVar2._16_8_ = lVar54;
          auVar2._24_8_ = lStack_be8;
          auVar28 = vpermq_avx2(auVar2,0x90);
          auVar28 = vpblendd_avx2(auVar28,ZEXT1632(ZEXT816(0) << 0x40),3);
          lVar29 = auVar28._0_8_;
          lVar53 = auVar28._8_8_;
          lVar54 = auVar28._16_8_;
          lStack_be8 = auVar28._24_8_;
        }
        local_948 = lStack_be8;
        local_220 = local_980;
        uStack_218 = uStack_978;
        uStack_210 = uStack_970;
        uStack_208 = uStack_968;
        local_240 = local_9c0;
        uStack_238 = uStack_9b8;
        uStack_230 = uStack_9b0;
        uStack_228 = uStack_9a8;
        auVar16._8_8_ = uStack_978;
        auVar16._0_8_ = local_980;
        auVar16._16_8_ = uStack_970;
        auVar16._24_8_ = uStack_968;
        auVar15._8_8_ = uStack_9b8;
        auVar15._0_8_ = local_9c0;
        auVar15._16_8_ = uStack_9b0;
        auVar15._24_8_ = uStack_9a8;
        local_2a0 = vpcmpgtq_avx2(auVar16,auVar15);
        local_260 = local_9e0;
        uStack_258 = uStack_9d8;
        uStack_250 = uStack_9d0;
        uStack_248 = uStack_9c8;
        local_280 = local_9a0;
        uStack_278 = uStack_998;
        uStack_270 = uStack_990;
        uStack_268 = uStack_988;
        auVar14._8_8_ = uStack_9d8;
        auVar14._0_8_ = local_9e0;
        auVar14._16_8_ = uStack_9d0;
        auVar14._24_8_ = uStack_9c8;
        auVar13._8_8_ = uStack_998;
        auVar13._0_8_ = local_9a0;
        auVar13._16_8_ = uStack_990;
        auVar13._24_8_ = uStack_988;
        local_2c0 = vpcmpgtq_avx2(auVar14,auVar13);
        local_2e0 = vpor_avx2(local_2a0,local_2c0);
        if ((((((((((((((((((((((((((((((((local_2e0 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (local_2e0 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_2e0 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_2e0 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_2e0 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_2e0 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_2e0 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_2e0 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_2e0 >> 0x47 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_2e0 >> 0x4f & (undefined1  [32])0x1) !=
                                 (undefined1  [32])0x0) ||
                                (local_2e0 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (local_2e0 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (local_2e0 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || (local_2e0 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                             ) || (local_2e0 >> 0x77 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(local_2e0 >> 0x7f,0) != '\0') ||
                          (local_2e0 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_2e0 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_2e0 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_2e0 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_2e0 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_2e0 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_2e0 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_2e0 >> 0xbf,0) != '\0') ||
                  (local_2e0 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_2e0 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_2e0 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_2e0 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_2e0 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (local_2e0 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_2e0 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            local_2e0[0x1f] < '\0') {
          local_a28->flag = local_a28->flag | 0x40;
          local_948 = 0;
          local_870 = 0;
          local_874 = 0;
        }
        local_a28->score = (int)local_948;
        local_a28->end_query = local_870;
        local_a28->end_ref = local_874;
        parasail_free(local_8c0);
        parasail_free(local_8b8);
        parasail_free(local_8b0);
        parasail_free(local_8a8);
        parasail_free(local_8a0);
        local_840 = local_a28;
      }
    }
  }
  return local_840;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vE, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vHp = _mm256_add_epi64(vHp, vW);
            vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[i]));
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vHt = _mm256_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            vF = _mm256_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        vH = _mm256_max_epi64_rpl(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vF, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vH = _mm256_max_epi64_rpl(vHt, vF);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}